

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.cpp
# Opt level: O1

Matrix3x3 * CGL::Matrix3x3::identity(void)

{
  long lVar1;
  double *pdVar2;
  int i;
  long lVar3;
  Matrix3x3 *B;
  double *in_RDI;
  long lVar4;
  uint uVar5;
  
  in_RDI[6] = 0.0;
  in_RDI[7] = 0.0;
  in_RDI[4] = 0.0;
  in_RDI[5] = 0.0;
  in_RDI[2] = 0.0;
  in_RDI[3] = 0.0;
  *in_RDI = 0.0;
  in_RDI[1] = 0.0;
  in_RDI[8] = 0.0;
  lVar1 = 0;
  lVar3 = 0;
  pdVar2 = in_RDI;
  do {
    lVar4 = 0;
    do {
      uVar5 = 0x3ff00000;
      if (lVar1 != lVar4) {
        uVar5 = 0;
      }
      *(ulong *)((long)pdVar2 + lVar4) = (ulong)uVar5 << 0x20;
      lVar4 = lVar4 + 0x18;
    } while (lVar4 != 0x48);
    lVar3 = lVar3 + 1;
    pdVar2 = pdVar2 + 1;
    lVar1 = lVar1 + 0x18;
  } while (lVar3 != 3);
  *in_RDI = 1.0;
  in_RDI[3] = 0.0;
  in_RDI[1] = 0.0;
  in_RDI[2] = 0.0;
  in_RDI[4] = 1.0;
  in_RDI[7] = 0.0;
  in_RDI[5] = 0.0;
  in_RDI[6] = 0.0;
  in_RDI[8] = 1.0;
  return (Matrix3x3 *)in_RDI;
}

Assistant:

Matrix3x3 Matrix3x3::identity( void ) {
    Matrix3x3 B;

    B(0,0) = 1.; B(0,1) = 0.; B(0,2) = 0.;
    B(1,0) = 0.; B(1,1) = 1.; B(1,2) = 0.;
    B(2,0) = 0.; B(2,1) = 0.; B(2,2) = 1.;

    return B;
  }